

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_libc.c
# Opt level: O0

err_t OpenDir(filestream *p,tchar_t *Path,int Flags)

{
  DIR *pDVar1;
  int *piVar2;
  tchar_t *ptStack_20;
  int Flags_local;
  tchar_t *Path_local;
  filestream *p_local;
  
  if (p->FindDir != (DIR *)0x0) {
    closedir((DIR *)p->FindDir);
  }
  ptStack_20 = Path;
  if (*Path == '\0') {
    ptStack_20 = "/";
  }
  pDVar1 = opendir(ptStack_20);
  p->FindDir = (DIR *)pDVar1;
  if (p->FindDir == (DIR *)0x0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x14) {
      p_local = (filestream *)0xfffffffffffffff2;
    }
    else {
      p_local = (filestream *)0xfffffffffffffff8;
    }
  }
  else {
    tcscpy_s(p->DirPath,0x100,ptStack_20);
    AddPathDelimiter(p->DirPath,0x100);
    p_local = (filestream *)0x0;
  }
  return (err_t)p_local;
}

Assistant:

static err_t OpenDir(filestream* p,const tchar_t* Path,int UNUSED_PARAM(Flags))
{
    if (p->FindDir)
        closedir(p->FindDir);

    if (Path[0]==0)
        Path = T("/");

    p->FindDir = opendir(Path);
    if (!p->FindDir)
    {
        if (errno == ENOTDIR)
            return ERR_NOT_DIRECTORY;
        else
            return ERR_FILE_NOT_FOUND;
    }

    tcscpy_s(p->DirPath,TSIZEOF(p->DirPath),Path);
    AddPathDelimiter(p->DirPath,TSIZEOF(p->DirPath));
    return ERR_NONE;
}